

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O0

bool __thiscall
ON_Extrusion::IsContinuous
          (ON_Extrusion *this,continuity c,double s,double t,int *hint,double point_tolerance,
          double d1_tolerance,double d2_tolerance,double cos_angle_tolerance,
          double curvature_tolerance)

{
  int iVar1;
  int *local_80;
  double local_70;
  double curvet;
  int *crv_hint;
  double curvature_tolerance_local;
  double cos_angle_tolerance_local;
  double d2_tolerance_local;
  double d1_tolerance_local;
  double point_tolerance_local;
  int *hint_local;
  double t_local;
  double s_local;
  continuity c_local;
  ON_Extrusion *this_local;
  
  if (this->m_profile == (ON_Curve *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    local_70 = s;
    curvet = (double)hint;
    if ((this->m_bTransposed & 1U) == 0) {
      if (hint == (int *)0x0) {
        local_80 = (int *)0x0;
      }
      else {
        local_80 = hint + 1;
      }
      curvet = (double)local_80;
      local_70 = t;
    }
    iVar1 = (*(this->m_profile->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x37])
                      (local_70,point_tolerance,d1_tolerance,d2_tolerance,cos_angle_tolerance,
                       curvature_tolerance,this->m_profile,(ulong)c,curvet);
    this_local._7_1_ = (bool)((byte)iVar1 & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Extrusion::IsContinuous(
  ON::continuity c,
  double s, 
  double t, 
  int* hint,
  double point_tolerance,
  double d1_tolerance,
  double d2_tolerance,
  double cos_angle_tolerance,
  double curvature_tolerance
  ) const
{
  if ( !m_profile )
    return false;
  int* crv_hint = 0;
  double curvet;
  if ( m_bTransposed )
  {
    curvet = s;
    crv_hint = hint;
  }
  else
  {
    curvet = t;
    crv_hint = hint ? hint+1 : 0;
  }
  return m_profile->IsContinuous(c,curvet,crv_hint,point_tolerance,d1_tolerance,d2_tolerance,cos_angle_tolerance,curvature_tolerance);
}